

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O0

int is_interintra_allowed(MB_MODE_INFO *mbmi)

{
  int iVar1;
  BLOCK_SIZE *in_RDI;
  bool local_9;
  
  iVar1 = is_interintra_allowed_bsize(*in_RDI);
  local_9 = false;
  if (iVar1 != 0) {
    iVar1 = is_interintra_allowed_mode(in_RDI[2]);
    local_9 = false;
    if (iVar1 != 0) {
      iVar1 = is_interintra_allowed_ref((MV_REFERENCE_FRAME *)(in_RDI + 0x10));
      local_9 = iVar1 != 0;
    }
  }
  return (int)local_9;
}

Assistant:

static inline int is_interintra_allowed(const MB_MODE_INFO *mbmi) {
  return is_interintra_allowed_bsize(mbmi->bsize) &&
         is_interintra_allowed_mode(mbmi->mode) &&
         is_interintra_allowed_ref(mbmi->ref_frame);
}